

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void adjust_assign(LexState *ls,int nvars,int nexps,expdesc *e)

{
  FuncState *fs;
  int iVar1;
  int n;
  
  fs = ls->fs;
  n = nvars - nexps;
  if (e->k - VCALL < 2) {
    iVar1 = -1;
    if (-1 < n) {
      iVar1 = n;
    }
    luaK_setreturns(fs,e,iVar1 + 1);
    if (0 < n) {
LAB_0010fe2f:
      luaK_reserveregs(fs,n);
      return;
    }
  }
  else {
    if (e->k != VVOID) {
      luaK_exp2nextreg(fs,e);
    }
    if (0 < n) {
      luaK_nil(fs,(uint)fs->freereg,n);
      goto LAB_0010fe2f;
    }
  }
  fs->freereg = fs->freereg + (char)n;
  return;
}

Assistant:

static void adjust_assign (LexState *ls, int nvars, int nexps, expdesc *e) {
  FuncState *fs = ls->fs;
  int needed = nvars - nexps;  /* extra values needed */
  if (hasmultret(e->k)) {  /* last expression has multiple returns? */
    int extra = needed + 1;  /* discount last expression itself */
    if (extra < 0)
      extra = 0;
    luaK_setreturns(fs, e, extra);  /* last exp. provides the difference */
  }
  else {
    if (e->k != VVOID)  /* at least one expression? */
      luaK_exp2nextreg(fs, e);  /* close last expression */
    if (needed > 0)  /* missing values? */
      luaK_nil(fs, fs->freereg, needed);  /* complete with nils */
  }
  if (needed > 0)
    luaK_reserveregs(fs, needed);  /* registers for extra values */
  else  /* adding 'needed' is actually a subtraction */
    fs->freereg += needed;  /* remove extra values */
}